

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedback::CaptureSpecialInterleaved::iterate(CaptureSpecialInterleaved *this)

{
  RenderContext *pRVar1;
  ContextInfo *this_00;
  TestContext *pTVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  bool local_4b9;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  byte local_1f;
  bool local_1e;
  undefined1 local_1d;
  deUint32 local_1c;
  bool test_error;
  bool is_ok;
  ApiType AStack_18;
  bool is_arb_tf_3;
  byte local_11;
  CaptureSpecialInterleaved *pCStack_10;
  bool is_at_least_gl_40;
  CaptureSpecialInterleaved *this_local;
  
  pCStack_10 = this;
  pRVar1 = deqp::Context::getRenderContext(this->m_context);
  AStack_18.m_bits = (*pRVar1->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::core(4,0);
  local_11 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)local_1c);
  this_00 = deqp::Context::getContextInfo(this->m_context);
  local_1d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_transform_feedback3");
  local_1e = true;
  local_1f = 0;
  if (((local_11 & 1) != 0) || ((bool)local_1d)) {
    prepareAndBind(this);
    draw(this);
    local_4b9 = false;
    if ((local_1e & 1U) != 0) {
      local_4b9 = check(this);
    }
    local_1e = local_4b9;
  }
  clean(this);
  if ((local_1e & 1U) == 0) {
    if ((local_1f & 1) == 0) {
      pTVar2 = deqp::Context::getTestContext(this->m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<(&local_4b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_4b0,(char (*) [41])"Capture Special Interleaved have failed.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4b0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar2 = deqp::Context::getTestContext(this->m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::TestLog::operator<<(&local_330,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_330,
                          (char (*) [51])"Capture Special Interleaved have approached error.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_330);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    pTVar2 = deqp::Context::getTestContext(this->m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_1b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [41])"Capture Special Interleaved have passed.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::CaptureSpecialInterleaved::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_3	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || is_arb_tf_3)
		{
			prepareAndBind();
			draw();

			is_ok = is_ok && check();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Special Interleaved have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Capture Special Interleaved have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Special Interleaved have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}